

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void Excel::Parser::loadSheet
               (size_t sheetIdx,BoundSheet *boundSheet,Stream *stream,IStorage *storage)

{
  Exception *pEVar1;
  allocator local_211;
  BOF bof;
  wstring local_208;
  Record record;
  
  (*stream->_vptr_Stream[4])(stream,(ulong)(uint)boundSheet->m_BOFPosition,0);
  bof.m_version = UnknownVersion;
  bof.m_type = UnknownType;
  Record::Record(&record,stream);
  BOF::parse(&bof,&record);
  Record::~Record(&record);
  if (bof.m_version != BIFF8) {
    pEVar1 = (Exception *)__cxa_allocate_exception(0x30);
    std::__cxx11::wstring::wstring
              ((wstring *)&record,L"Unsupported BIFF version. BIFF8 is supported only.",
               (allocator *)&local_208);
    Exception::Exception(pEVar1,(wstring *)&record);
    __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
  }
  do {
    Record::Record(&record,stream);
    if (record.m_code == 6) {
      handleFORMULA(&record,stream,sheetIdx,storage);
    }
    else if (record.m_code == 0x7e) {
LAB_00116943:
      handleRK(&record,sheetIdx,storage);
    }
    else if (record.m_code == 0xbd) {
      handleMULRK(&record,sheetIdx,storage);
    }
    else if (record.m_code == 0xfd) {
      handleLabelSST(&record,sheetIdx,storage);
    }
    else if (record.m_code == 0x203) {
      handleNUMBER(&record,sheetIdx,storage);
    }
    else if (record.m_code == 0x204) {
      handleLabel(&record,sheetIdx,storage);
    }
    else {
      if (record.m_code == 0x27e) goto LAB_00116943;
      if (record.m_code == 10) {
        Record::~Record(&record);
        return;
      }
      if (record.m_code == 0xffff) {
        pEVar1 = (Exception *)__cxa_allocate_exception(0x30);
        std::__cxx11::wstring::wstring((wstring *)&local_208,L"Wrong format.",&local_211);
        Exception::Exception(pEVar1,&local_208);
        __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
      }
    }
    Record::~Record(&record);
  } while( true );
}

Assistant:

inline void
Parser::loadSheet( size_t sheetIdx, const BoundSheet & boundSheet,
	Stream & stream, IStorage & storage )
{
	stream.seek( boundSheet.BOFPosition(), Stream::FromBeginning );
	BOF bof;

	{
		Record record( stream );

		bof.parse( record );
	}

	if( bof.version() != BOF::BIFF8 )
		throw Exception( L"Unsupported BIFF version. BIFF8 is supported only." );

	while( true )
	{
		Record record( stream );

		switch( record.code() )
		{
			case XL_LABELSST :
				handleLabelSST( record, sheetIdx, storage );
				break;

			case XL_LABEL :
				handleLabel( record, sheetIdx, storage );
				break;

			case XL_RK :
			case XL_RK2 :
				handleRK( record, sheetIdx, storage );
				break;

			case XL_MULRK :
				handleMULRK( record, sheetIdx, storage );
				break;

			case XL_NUMBER :
				handleNUMBER( record, sheetIdx, storage );
				break;

			case XL_FORMULA :
				handleFORMULA( record, stream, sheetIdx, storage );
				break;

			case XL_EOF :
				return;

			case XL_UNKNOWN :
				throw Exception( L"Wrong format." );

			default:
				break;
		}
	}
}